

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

void Abc_ConvertAigToGia_rec1(Gia_Man_t *p,Hop_Obj_t *pObj)

{
  uint Lit;
  uint Lit_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  Gia_Obj_t *pObj_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x3a7,"void Abc_ConvertAigToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) != 4) {
    return;
  }
  Abc_ConvertAigToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Abc_ConvertAigToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  Lit_00 = 0xffffffff;
  piVar4 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  Lit = Lit_00;
  if (piVar4 != (int *)0x0) {
    Lit = Abc_LitNotCond(*piVar4,(uint)pObj->pFanin0 & 1);
  }
  piVar4 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  if (piVar4 != (int *)0x0) {
    Lit_00 = Abc_LitNotCond(*piVar4,(uint)pObj->pFanin1 & 1);
  }
  if (p->fGiaSimple == 0) {
    uVar3 = Lit;
    if ((int)Lit < 2) {
      uVar3 = Lit_00;
      if (Lit == 0) {
        uVar3 = Lit;
      }
      goto LAB_006afed7;
    }
    if ((int)Lit_00 < 2) {
      if (Lit_00 == 0) {
        uVar3 = Lit_00;
      }
      goto LAB_006afed7;
    }
    if ((Lit == Lit_00) || (uVar3 = 0, (Lit_00 ^ Lit) == 1)) goto LAB_006afed7;
  }
  pObj_00 = Gia_ManAppendObj(p);
  if (((int)Lit < 0) || (iVar1 = Abc_Lit2Var(Lit), p->nObjs <= iVar1)) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if (((int)Lit_00 < 0) || (iVar1 = Abc_Lit2Var(Lit_00), p->nObjs <= iVar1)) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if (p->fGiaSimple == 0) {
    iVar1 = Abc_Lit2Var(Lit);
    iVar2 = Abc_Lit2Var(Lit_00);
    if (iVar1 == iVar2) {
      __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
  }
  iVar1 = Gia_ObjId(p,pObj_00);
  iVar2 = Abc_Lit2Var(Lit);
  uVar8 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
  if (Lit < Lit_00) {
    *(ulong *)pObj_00 = (ulong)((Lit & 1) << 0x1d) | *(ulong *)pObj_00 & 0xffffffffc0000000 | uVar8;
    iVar1 = Gia_ObjId(p,pObj_00);
    iVar2 = Abc_Lit2Var(Lit_00);
    uVar8 = (ulong)(Lit_00 & 1) << 0x3d |
            *(ulong *)pObj_00 & 0xc0000000ffffffff | (ulong)(iVar1 - iVar2 & 0x1fffffff) << 0x20;
  }
  else {
    *(ulong *)pObj_00 =
         (ulong)(Lit & 1) << 0x3d | *(ulong *)pObj_00 & 0xc0000000ffffffff | uVar8 << 0x20;
    iVar1 = Gia_ObjId(p,pObj_00);
    iVar2 = Abc_Lit2Var(Lit_00);
    uVar8 = (ulong)((Lit_00 & 1) << 0x1d) | *(ulong *)pObj_00 & 0xffffffffc0000000 |
            (ulong)(iVar1 - iVar2 & 0x1fffffff);
  }
  *(ulong *)pObj_00 = uVar8;
  if (p->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(p,pObj_00 + -(uVar8 & 0x1fffffff),pObj_00);
    Gia_ObjAddFanout(p,pObj_00 + -((ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff),pObj_00);
  }
  if (p->fSweeper != 0) {
    uVar5 = *(ulong *)pObj_00 & 0x1fffffff;
    uVar8 = *(ulong *)pObj_00 >> 0x20 & 0x1fffffff;
    uVar6 = 0x4000000000000000;
    uVar7 = 0x4000000000000000;
    if (((uint)*(ulong *)(pObj_00 + -uVar5) >> 0x1e & 1) == 0) {
      uVar7 = 0x40000000;
    }
    *(ulong *)(pObj_00 + -uVar5) = uVar7 | *(ulong *)(pObj_00 + -uVar5);
    uVar7 = *(ulong *)(pObj_00 + -uVar8);
    if (((uint)uVar7 >> 0x1e & 1) == 0) {
      uVar6 = 0x40000000;
    }
    *(ulong *)(pObj_00 + -uVar8) = uVar6 | uVar7;
    uVar8 = *(ulong *)pObj_00;
    *(ulong *)pObj_00 =
         uVar8 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar8 >> 0x3d) ^ (uint)(uVar7 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pObj_00 + -uVar5) >> 0x3f) ^
                (uint)(uVar8 >> 0x1d) & 7)) << 0x3f;
  }
  if (p->fBuiltInSim != 0) {
    uVar8 = *(ulong *)pObj_00;
    *(ulong *)pObj_00 =
         uVar8 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar8 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pObj_00 + -(uVar8 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pObj_00 + -(uVar8 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar8 >> 0x1d) & 7)) << 0x3f;
    iVar1 = Gia_ObjId(p,pObj_00);
    Gia_ManBuiltInSimPerform(p,iVar1);
  }
  if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(p,pObj_00);
  }
  iVar1 = Gia_ObjId(p,pObj_00);
  uVar3 = iVar1 * 2;
LAB_006afed7:
  (pObj->field_0).iData = uVar3;
  if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
    return;
  }
  __assert_fail("!Hop_ObjIsMarkA(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                ,0x3ad,"void Abc_ConvertAigToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Abc_ConvertAigToGia_rec1( Gia_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToGia_rec1( p, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToGia_rec1( p, Hop_ObjFanin1(pObj) );
    pObj->iData = Gia_ManAppendAnd2( p, Hop_ObjChild0CopyI(pObj), Hop_ObjChild1CopyI(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}